

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMpsFF.cpp
# Opt level: O0

Parsekey __thiscall
free_format_parser::HMpsFF::parseQuadRows
          (HMpsFF *this,HighsLogOptions *log_options,istream *file,Parsekey keyword)

{
  HighsLogOptions *log_options_;
  bool bVar1;
  ulong uVar2;
  pointer ppVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  HMpsFF *pHVar7;
  int in_ECX;
  HighsLogOptions *in_RSI;
  long in_RDI;
  bool bVar8;
  double dVar9;
  double coeff;
  bool is_nan;
  int entry;
  Parsekey key_1;
  size_t end_1;
  size_t begin_1;
  bool skip;
  vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_> *qentries;
  Parsekey key;
  size_t end;
  size_t begin;
  bool skip_1;
  iterator mit;
  string rowname;
  HighsInt qrowidx;
  HighsInt qcolidx;
  HighsInt rowidx;
  size_t end_coeff_name;
  size_t end_row_name;
  string coeff_name;
  string row_name;
  string col_name;
  string strline;
  string section_name;
  bool qcmatrix;
  string *in_stack_fffffffffffffd28;
  HMpsFF *in_stack_fffffffffffffd30;
  istream *in_stack_fffffffffffffd38;
  istream *in_stack_fffffffffffffd40;
  HMpsFF *in_stack_fffffffffffffd48;
  vector<std::vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>,_std::allocator<std::vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>_>_>
  *in_stack_fffffffffffffd50;
  undefined8 in_stack_fffffffffffffd68;
  string *in_stack_fffffffffffffd70;
  HMpsFF *in_stack_fffffffffffffd78;
  undefined7 in_stack_fffffffffffffd80;
  undefined1 in_stack_fffffffffffffd87;
  string *in_stack_fffffffffffffd88;
  string *in_stack_fffffffffffffda0;
  string *in_stack_fffffffffffffda8;
  istream *local_238;
  undefined7 in_stack_fffffffffffffe38;
  byte in_stack_fffffffffffffe3f;
  size_t *in_stack_fffffffffffffe40;
  size_t *in_stack_fffffffffffffe48;
  undefined8 in_stack_fffffffffffffe50;
  undefined8 in_stack_fffffffffffffe58;
  string local_1a0 [32];
  int local_180;
  Parsekey local_17c;
  HMpsFF *local_178;
  undefined8 local_170;
  byte local_161;
  istream *local_160;
  Parsekey local_154;
  undefined8 local_150;
  undefined8 local_148;
  byte local_139;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_138;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_130;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_128;
  undefined4 local_11c;
  string local_118 [36];
  int local_f4;
  HighsInt local_f0;
  int local_ec;
  HMpsFF *local_e8;
  string *local_e0;
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [48];
  string local_48 [35];
  byte local_25;
  HighsLogOptions *local_18;
  Parsekey local_4;
  
  local_25 = in_ECX == 0xc;
  local_18 = in_RSI;
  std::__cxx11::string::string(local_48);
  if ((local_25 & 1) == 0) {
    std::__cxx11::string::operator=(local_48,"QSECTION");
  }
  else {
    std::__cxx11::string::operator=(local_48,"QCMATRIX");
  }
  std::__cxx11::string::string(local_78);
  std::__cxx11::string::string(local_98);
  std::__cxx11::string::string(local_b8);
  std::__cxx11::string::string(local_d8);
  first_word(in_stack_fffffffffffffda8,(size_t)in_stack_fffffffffffffda0);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    local_128._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 *)in_stack_fffffffffffffd28,(key_type *)0x463cf9);
    local_130._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                *)in_stack_fffffffffffffd28);
    bVar1 = std::__detail::operator==(&local_128,&local_130);
    bVar8 = true;
    if (!bVar1) {
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
                             *)0x463d61);
      bVar8 = ppVar3->second == -2;
    }
    if (bVar8) {
      local_138._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  *)in_stack_fffffffffffffd28);
      bVar8 = std::__detail::operator==(&local_128,&local_138);
      log_options_ = local_18;
      if (bVar8) {
        *(undefined1 *)(in_RDI + 8) = 1;
        uVar4 = std::__cxx11::string::c_str();
        uVar6 = std::__cxx11::string::c_str();
        highsLogUser(log_options_,kWarning,"Row name \"%s\" in %s section is not defined: ignored\n"
                     ,uVar4,uVar6);
      }
      do {
        do {
          bVar8 = getMpsLine(in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
                             (string *)in_stack_fffffffffffffd38,(bool *)in_stack_fffffffffffffd30);
          if (!bVar8) {
            local_4 = kFail;
            goto LAB_004645ce;
          }
        } while ((local_139 & 1) != 0);
        bVar8 = timeout(in_stack_fffffffffffffd30);
        if (bVar8) {
          local_4 = kTimeout;
          goto LAB_004645ce;
        }
        local_148 = 0;
        local_150 = 0;
        local_154 = checkFirstWord((HMpsFF *)in_stack_fffffffffffffe58,
                                   (string *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                                   in_stack_fffffffffffffe40,
                                   (string *)
                                   CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
      } while (local_154 == kNone);
      uVar4 = std::__cxx11::string::c_str();
      highsLogDev(local_18,kInfo,"readMPS: Read %s  OK\n",uVar4);
      local_4 = local_154;
    }
    else {
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
                             *)0x463f96);
      local_ec = ppVar3->second;
      if (-1 < local_ec) {
        std::
        vector<std::vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>,_std::allocator<std::vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>_>_>
        ::resize(in_stack_fffffffffffffd50,(size_type)in_stack_fffffffffffffd48);
      }
      if (local_ec == -1) {
        local_238 = (istream *)(in_RDI + 0x2d0);
      }
      else {
        local_238 = (istream *)
                    std::
                    vector<std::vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>,_std::allocator<std::vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>_>_>
                    ::operator[]((vector<std::vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>,_std::allocator<std::vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>_>_>
                                  *)(in_RDI + 0x2e8),(long)local_ec);
      }
      local_160 = local_238;
LAB_0046401f:
      bVar8 = getMpsLine(in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
                         (string *)in_stack_fffffffffffffd38,(bool *)in_stack_fffffffffffffd30);
      if (bVar8) {
        if ((local_161 & 1) == 0) {
          bVar8 = timeout(in_stack_fffffffffffffd30);
          if (bVar8) {
            local_4 = kTimeout;
            goto LAB_004645ce;
          }
          local_170 = 0;
          local_178 = (HMpsFF *)0x0;
          local_17c = checkFirstWord((HMpsFF *)in_stack_fffffffffffffe58,
                                     (string *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                                     in_stack_fffffffffffffe40,
                                     (string *)
                                     CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
          if (local_17c != kNone) {
            uVar4 = std::__cxx11::string::c_str();
            highsLogDev(local_18,kInfo,"readMPS: Read %s  OK\n",uVar4);
            local_4 = local_17c;
            goto LAB_004645ce;
          }
          local_f0 = getColIdx(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,
                               SUB81((ulong)in_stack_fffffffffffffd68 >> 0x38,0));
          for (local_180 = 0; local_180 < 2; local_180 = local_180 + 1) {
            std::__cxx11::string::operator=(local_b8,"");
            first_word(in_stack_fffffffffffffda8,(size_t)in_stack_fffffffffffffda0);
            in_stack_fffffffffffffda0 = local_1a0;
            std::__cxx11::string::operator=(local_b8,in_stack_fffffffffffffda0);
            std::__cxx11::string::~string(in_stack_fffffffffffffda0);
            in_stack_fffffffffffffda8 =
                 (string *)
                 first_word_end(in_stack_fffffffffffffd88,
                                CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
            local_e0 = in_stack_fffffffffffffda8;
            bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffffd30,(char *)in_stack_fffffffffffffd28);
            if (bVar8) break;
            std::__cxx11::string::operator=(local_d8,"");
            first_word(in_stack_fffffffffffffda8,(size_t)in_stack_fffffffffffffda0);
            in_stack_fffffffffffffd88 = (string *)&stack0xfffffffffffffe40;
            std::__cxx11::string::operator=(local_d8,(string *)in_stack_fffffffffffffd88);
            std::__cxx11::string::~string((string *)in_stack_fffffffffffffd88);
            local_e8 = (HMpsFF *)
                       first_word_end(in_stack_fffffffffffffd88,
                                      CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80))
            ;
            in_stack_fffffffffffffd87 =
                 std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffffd30,(char *)in_stack_fffffffffffffd28);
            if ((bool)in_stack_fffffffffffffd87) {
              trim((string *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
              trim((string *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
              uVar4 = std::__cxx11::string::c_str();
              uVar6 = std::__cxx11::string::c_str();
              uVar5 = std::__cxx11::string::c_str();
              highsLogUser(local_18,kError,
                           "%s has no coefficient for entry \"%s\" in column \"%s\"\n",uVar4,uVar6,
                           uVar5);
              local_4 = kFail;
              goto LAB_004645ce;
            }
            local_f4 = getColIdx(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,
                                 SUB81((ulong)in_stack_fffffffffffffd68 >> 0x38,0));
            in_stack_fffffffffffffe3f = 0;
            dVar9 = getValue((HMpsFF *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80)
                             ,(string *)in_stack_fffffffffffffd78,(bool *)in_stack_fffffffffffffd70,
                             (HighsInt)((ulong)in_stack_fffffffffffffd68 >> 0x20));
            if ((in_stack_fffffffffffffe3f & 1) != 0) {
              uVar4 = std::__cxx11::string::c_str();
              uVar6 = std::__cxx11::string::c_str();
              highsLogUser(local_18,kError,
                           "Hessian coefficient for entry \"%s\" in column \"%s\" is NaN\n",uVar4,
                           uVar6);
              local_4 = kFail;
              goto LAB_004645ce;
            }
            if ((dVar9 != 0.0) || (NAN(dVar9))) {
              if ((local_25 & 1) == 0) {
                in_stack_fffffffffffffd38 = local_160;
                std::make_tuple<int&,int&,double&>
                          ((int *)local_160,(int *)in_stack_fffffffffffffd30,
                           (double *)in_stack_fffffffffffffd28);
                std::
                vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                ::push_back((vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                             *)in_stack_fffffffffffffd30,(value_type *)in_stack_fffffffffffffd28);
              }
              else if (local_f0 <= local_f4) {
                in_stack_fffffffffffffd40 = local_160;
                std::make_tuple<int&,int&,double&>
                          ((int *)in_stack_fffffffffffffd38,(int *)in_stack_fffffffffffffd30,
                           (double *)in_stack_fffffffffffffd28);
                std::
                vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                ::push_back((vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                             *)in_stack_fffffffffffffd30,(value_type *)in_stack_fffffffffffffd28);
              }
            }
            local_178 = local_e8;
            in_stack_fffffffffffffd30 = local_e8;
            pHVar7 = (HMpsFF *)std::__cxx11::string::length();
            if (in_stack_fffffffffffffd30 == pHVar7) break;
          }
        }
        goto LAB_0046401f;
      }
      local_4 = kFail;
    }
  }
  else {
    uVar4 = std::__cxx11::string::c_str();
    highsLogUser(local_18,kError,"No row name given in argument of %s\n",uVar4);
    local_4 = kFail;
  }
LAB_004645ce:
  local_11c = 1;
  std::__cxx11::string::~string(local_118);
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_48);
  return local_4;
}

Assistant:

typename HMpsFF::Parsekey HMpsFF::parseQuadRows(
    const HighsLogOptions& log_options, std::istream& file,
    const HMpsFF::Parsekey keyword) {
  // Parse Hessian information from QSECTION or QCMATRIX
  // section according to keyword
  const bool qcmatrix = keyword == HMpsFF::Parsekey::kQcmatrix;
  std::string section_name;
  if (qcmatrix) {
    section_name = "QCMATRIX";
  } else {
    section_name = "QSECTION";
  }
  std::string strline;
  std::string col_name;
  std::string row_name;
  std::string coeff_name;
  size_t end_row_name;
  size_t end_coeff_name;
  HighsInt rowidx;            // index of quadratic row
  HighsInt qcolidx, qrowidx;  // indices in quadratic coefs matrix

  // Get row name from section argument
  std::string rowname = first_word(section_args, 0);
  if (rowname.empty()) {
    highsLogUser(log_options, HighsLogType::kError,
                 "No row name given in argument of %s\n", section_name.c_str());
    return HMpsFF::Parsekey::kFail;
  }

  auto mit = rowname2idx.find(rowname);
  // if row of section does not exist or is free (index -2), then skip
  if (mit == rowname2idx.end() || mit->second == -2) {
    if (mit == rowname2idx.end()) {
      warning_issued_ = true;
      highsLogUser(log_options, HighsLogType::kWarning,
                   "Row name \"%s\" in %s section is not defined: ignored\n",
                   rowname.c_str(), section_name.c_str());
    }
    // read lines until start of new section
    bool skip;
    while (getMpsLine(file, strline, skip)) {
      if (skip) continue;
      if (timeout()) return HMpsFF::Parsekey::kTimeout;

      size_t begin = 0;
      size_t end = 0;
      HMpsFF::Parsekey key = checkFirstWord(strline, begin, end, col_name);

      // start of new section?
      if (key != Parsekey::kNone) {
        highsLogDev(log_options, HighsLogType::kInfo, "readMPS: Read %s  OK\n",
                    section_name.c_str());
        return key;
      }
    }
    return Parsekey::kFail;  // unexpected end of file
  }
  rowidx = mit->second;
  assert(rowidx >= -1);
  assert(rowidx < num_row);

  if (rowidx >= 0) qrows_entries.resize(num_row);
  assert(rowidx == -1 || qrows_entries.size() == static_cast<size_t>(num_row));

  auto& qentries = (rowidx == -1 ? q_entries : qrows_entries[rowidx]);

  bool skip;
  while (getMpsLine(file, strline, skip)) {
    if (skip) continue;
    if (timeout()) return HMpsFF::Parsekey::kTimeout;

    size_t begin = 0;
    size_t end = 0;
    HMpsFF::Parsekey key = checkFirstWord(strline, begin, end, col_name);

    // start of new section?
    if (key != Parsekey::kNone) {
      highsLogDev(log_options, HighsLogType::kInfo, "readMPS: Read %s  OK\n",
                  section_name.c_str());
      return key;
    }

    // Get the column index
    qcolidx = getColIdx(col_name);
    assert(qcolidx >= 0 && qcolidx < num_col);

    // Loop over the maximum of two entries per row of the file
    for (int entry = 0; entry < 2; entry++) {
      // Get the row name
      row_name = "";
      row_name = first_word(strline, end);
      end_row_name = first_word_end(strline, end);

      if (row_name == "") break;

      coeff_name = "";
      coeff_name = first_word(strline, end_row_name);
      end_coeff_name = first_word_end(strline, end_row_name);

      if (coeff_name == "") {
        trim(row_name);
        trim(col_name);
        highsLogUser(
            log_options, HighsLogType::kError,
            "%s has no coefficient for entry \"%s\" in column \"%s\"\n",
            section_name.c_str(), row_name.c_str(), col_name.c_str());
        return HMpsFF::Parsekey::kFail;
      }

      qrowidx = getColIdx(row_name);
      assert(qrowidx >= 0 && qrowidx < num_col);

      bool is_nan = false;
      double coeff = getValue(coeff_name, is_nan);  // atof(word.c_str());
      if (is_nan) {
        highsLogUser(
            log_options, HighsLogType::kError,
            "Hessian coefficient for entry \"%s\" in column \"%s\" is NaN\n",
            row_name.c_str(), col_name.c_str());
        return HMpsFF::Parsekey::kFail;
      }
      if (coeff) {
        if (qcmatrix) {
          // QCMATRIX has the whole Hessian, so store the entry if the
          // entry is in the lower triangle
          if (qrowidx >= qcolidx)
            qentries.push_back(std::make_tuple(qrowidx, qcolidx, coeff));
        } else {
          // QSECTION has the lower triangle of the Hessian
          qentries.push_back(std::make_tuple(qrowidx, qcolidx, coeff));
        }
      }
      end = end_coeff_name;
      // Don't read more if end of line reached
      if (end == strline.length()) break;
    }
  }

  return HMpsFF::Parsekey::kFail;
}